

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_167d4d1::cmMacroFunctionBlocker::Replay
          (cmMacroFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *status)

{
  cmMakefile *this_00;
  _Alloc_hider _Var1;
  string *name;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  cmState *this_01;
  _Any_data local_1b8;
  code *local_1a8;
  code *pcStack_1a0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_198;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  element_type *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_160;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  undefined1 auStack_110 [32];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  cmListFileContext local_a0;
  
  this_00 = status->Makefile;
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"MACROS","");
  cmMakefile::AppendProperty
            (this_00,(string *)local_138,
             (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,false);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  local_c8 = &local_b8;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  auStack_110._24_8_ = 0;
  uStack_f0._0_1_ = false;
  uStack_f0._1_7_ = 0;
  auStack_110._8_8_ = 0;
  auStack_110._16_8_ = 0;
  local_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auStack_110._0_8_ = (pointer)0x0;
  local_138._16_8_ = 0;
  local_138._24_8_ = 0;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_c0 = 0;
  local_b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_138,&this->Args);
  pcVar2 = (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  _Var1._M_p = (pointer)(functions->
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>)
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_158._0_8_ = local_138._24_8_;
  local_158._8_8_ = local_118;
  local_158._16_8_ = auStack_110._0_8_;
  (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138._24_8_ = pcVar2;
  local_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar3;
  auStack_110._0_8_ = _Var1._M_p;
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_158);
  std::__cxx11::string::_M_assign((string *)&local_c8);
  cmMakefile::RecordPolicies(this_00,(PolicyMap *)(auStack_110 + 8));
  this_01 = cmMakefile::GetState(this_00);
  name = (this->Args).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_1a8 = (code *)0x0;
  pcStack_1a0 = (code *)0x0;
  local_1b8._M_unused._M_object = (void *)0x0;
  local_1b8._8_8_ = 0;
  local_1b8._M_unused._M_object = operator_new(0x90);
  *(undefined8 *)local_1b8._M_unused._0_8_ = local_138._0_8_;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 8) = local_138._8_8_;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x10) = local_138._16_8_;
  local_138._16_8_ = 0;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (pointer)0x0;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x18) = local_138._24_8_;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_1b8._M_unused._0_8_ + 0x20) =
       local_118;
  ((_Alloc_hider *)((long)local_1b8._M_unused._0_8_ + 0x28))->_M_p = (pointer)auStack_110._0_8_;
  auStack_110._0_8_ = (pointer)0x0;
  local_138._24_8_ = 0;
  local_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x60) = local_d8;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x68) = uStack_d0;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x50) = local_e8;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x58) = uStack_e0;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x40) = auStack_110._24_8_;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x48) = uStack_f0;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x30) = auStack_110._8_8_;
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x38) = auStack_110._16_8_;
  *(code **)((long)local_1b8._M_unused._0_8_ + 0x70) =
       (code *)((long)local_1b8._M_unused._0_8_ + 0x80);
  if (local_c8 == &local_b8) {
    *(ulong *)((long)local_1b8._M_unused._0_8_ + 0x80) = CONCAT71(uStack_b7,local_b8);
    *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x88) = uStack_b0;
  }
  else {
    *(undefined1 **)((long)local_1b8._M_unused._0_8_ + 0x70) = local_c8;
    *(ulong *)((long)local_1b8._M_unused._0_8_ + 0x80) = CONCAT71(uStack_b7,local_b8);
  }
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x78) = local_c0;
  local_c0 = 0;
  local_b8 = 0;
  pcStack_1a0 = std::
                _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmMacroHelperCommand>
                ::_M_invoke;
  local_1a8 = std::
              _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmMacroHelperCommand>
              ::_M_manager;
  local_c8 = &local_b8;
  cmMakefile::GetBacktrace(this_00);
  cmListFileContext::cmListFileContext(&local_a0,&(this->super_cmFunctionBlocker).StartingContext);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            (&local_198,(cmListFileContext *)local_158);
  local_188._M_unused._M_object = (undefined8 *)0x0;
  local_188._8_8_ = 0;
  local_178 = (code *)0x0;
  local_170 = pcStack_1a0;
  if (local_1a8 != (code *)0x0) {
    local_188._M_unused._M_function_pointer = (_func_void *)local_1b8._M_unused._0_8_;
    local_188._8_8_ = local_1b8._8_8_;
    local_178 = local_1a8;
    local_1a8 = (code *)0x0;
    pcStack_1a0 = (code *)0x0;
  }
  local_168 = local_198.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  p_Stack_160 = local_198.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  local_198.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_198.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar4 = cmState::AddScriptedCommand
                    (this_01,name,
                     (BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
                      *)&local_188,this_00);
  if (p_Stack_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_160);
  }
  if (local_178 != (code *)0x0) {
    (*local_178)(&local_188,&local_188,__destroy_functor);
  }
  if (local_198.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_a0.DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_a0.DeferId.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    if (local_a0.DeferId.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p !=
        ((pointer)
        ((long)&local_a0.DeferId.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        + 0x10U))._M_p) {
      operator_delete((void *)local_a0.DeferId.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      local_a0.DeferId.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.FilePath._M_dataplus._M_p != &local_a0.FilePath.field_2) {
    operator_delete(local_a0.FilePath._M_dataplus._M_p,
                    local_a0.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.Name._M_dataplus._M_p != &local_a0.Name.field_2) {
    operator_delete(local_a0.Name._M_dataplus._M_p,local_a0.Name.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)(local_138 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  return bVar4;
}

Assistant:

bool cmMacroFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                    cmExecutionStatus& status)
{
  cmMakefile& mf = status.GetMakefile();
  mf.AppendProperty("MACROS", this->Args[0]);
  // create a new command and add it to cmake
  cmMacroHelperCommand f;
  f.Args = this->Args;
  f.Functions = std::move(functions);
  f.FilePath = this->GetStartingContext().FilePath;
  mf.RecordPolicies(f.Policies);
  return mf.GetState()->AddScriptedCommand(
    this->Args[0],
    BT<cmState::Command>(std::move(f),
                         mf.GetBacktrace().Push(this->GetStartingContext())),
    mf);
}